

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

int Kf_HashFindOrAdd(Kf_Set_t *p,int i)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = Kf_HashLookup(p,i);
  iVar4 = 0;
  if (uVar3 != 0xffffffff) {
    uVar1 = p->nTEntries;
    if (uVar1 == p->nLutSize) {
      iVar4 = 1;
    }
    else {
      if (p->pTable[uVar3] != 0) {
        __assert_fail("p->pTable[k] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                      ,0x186,"int Kf_HashFindOrAdd(Kf_Set_t *, int)");
      }
      p->pTable[uVar3] = i;
      p->pPlace[(int)uVar1] = uVar3;
      iVar2 = p->nTEntries;
      p->nTEntries = iVar2 + 1;
      p->pValue[uVar3] = iVar2;
    }
  }
  return iVar4;
}

Assistant:

static inline int Kf_HashFindOrAdd( Kf_Set_t * p, int i )
{
    int k = Kf_HashLookup( p, i );
    if ( k == -1 )
        return 0;
    if ( p->nTEntries == p->nLutSize )
        return 1;
    assert( p->pTable[k] == 0 );
    p->pTable[k] = i;
    p->pPlace[p->nTEntries] = k;
    p->pValue[k] = p->nTEntries++;
    return 0;
}